

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_filter.cpp
# Opt level: O1

void __thiscall tst_helpers_filter::filterValues(tst_helpers_filter *this)

{
  QSharedData *pQVar1;
  PromiseResolver<bool> PVar2;
  QArrayData *pQVar3;
  int *piVar4;
  bool bVar5;
  long *plVar6;
  PromiseData<QList<int>_> *pPVar7;
  const_iterator expectedBegin;
  long lVar8;
  QPromiseReject<QList<int>_> *reject;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<bool>::Data> local_108;
  PromiseResolver<bool> resolver;
  bool local_f1;
  QArrayData *local_f0;
  QList<int> local_e8;
  QPromise<QList<int>_> p;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<bool>::Data> local_c0;
  QArrayData *d;
  undefined8 uStack_b0;
  QArrayData *local_a8;
  _Invoker_type local_a0;
  undefined8 local_98;
  QList<int> local_88;
  function<void_(const_QList<bool>_&)> local_68;
  _Invoker_type local_40;
  
  reject = (QPromiseReject<QList<int>_> *)0x1;
  local_40 = (_Invoker_type)QArrayData::allocate(&d,4,8,3,KeepSize);
  local_f0 = d;
  *(undefined8 *)local_40 = 0x2b0000002a;
  *(undefined4 *)(local_40 + 8) = 0x2c;
  d = (QArrayData *)0x0;
  uStack_b0 = (pointer)0x0;
  local_a8 = (QArrayData *)0x0;
  lVar8 = 0;
  do {
    local_e8.d.d = (Data *)&PTR__QPromiseBase_00135530;
    plVar6 = (long *)operator_new(0x68);
    *plVar6 = 0;
    plVar6[1] = 0;
    plVar6[10] = 0;
    plVar6[0xb] = 0;
    plVar6[8] = 0;
    plVar6[9] = 0;
    plVar6[6] = 0;
    plVar6[7] = 0;
    plVar6[4] = 0;
    plVar6[5] = 0;
    plVar6[2] = 0;
    plVar6[3] = 0;
    plVar6[0xc] = 0;
    *plVar6 = (long)&PTR__PromiseDataBase_001355c8;
    QReadWriteLock::QReadWriteLock((QReadWriteLock *)(plVar6 + 2),0);
    *(undefined1 *)(plVar6 + 3) = 0;
    plVar6[4] = 0;
    plVar6[5] = 0;
    plVar6[6] = 0;
    plVar6[7] = 0;
    plVar6[8] = 0;
    plVar6[9] = 0;
    plVar6[10] = 0;
    *plVar6 = (long)&PTR__PromiseData_00135550;
    plVar6[0xb] = 0;
    plVar6[0xc] = 0;
    LOCK();
    *(int *)(plVar6 + 1) = (int)plVar6[1] + 1;
    UNLOCK();
    if (plVar6 != (long *)0x0) {
      LOCK();
      *(int *)(plVar6 + 1) = (int)plVar6[1] + 1;
      UNLOCK();
    }
    local_68.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_001354e8;
    local_e8.d.ptr = (int *)plVar6;
    local_68.super__Function_base._M_functor._8_8_ = plVar6;
    QtPromisePrivate::PromiseResolver<bool>::PromiseResolver(&resolver,(QPromise<bool> *)&local_68);
    local_68.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00135530;
    if ((long *)local_68.super__Function_base._M_functor._8_8_ != (long *)0x0) {
      LOCK();
      plVar6 = (long *)(local_68.super__Function_base._M_functor._8_8_ + 8);
      *(int *)plVar6 = *(int *)plVar6 + -1;
      UNLOCK();
      if ((*(int *)plVar6 == 0) &&
         ((long *)local_68.super__Function_base._M_functor._8_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_68.super__Function_base._M_functor._8_8_ + 8))();
      }
    }
    PVar2.m_d.d = resolver.m_d.d;
    if (resolver.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
    }
    local_108 = resolver.m_d.d;
    if (resolver.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
    }
    local_f1 = (bool)(~(byte)local_40[lVar8] & 1);
    QtPromisePrivate::PromiseResolver<bool>::resolve<bool>
              ((PromiseResolver<bool> *)&local_108,&local_f1);
    if (PVar2.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)PVar2.m_d.d = *(int *)PVar2.m_d.d + -1;
      UNLOCK();
      if (*(int *)PVar2.m_d.d == 0) {
        operator_delete((void *)PVar2.m_d.d,0x10);
      }
    }
    if (local_108.d != (Data *)0x0) {
      LOCK();
      ((local_108.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((local_108.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((local_108.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
         (local_108.d != (Data *)0x0)) {
        operator_delete(local_108.d,0x10);
      }
    }
    if (resolver.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
      UNLOCK();
      if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
        operator_delete((void *)resolver.m_d.d,0x10);
      }
    }
    local_e8.d.d = (Data *)&PTR__QPromiseBase_001354e8;
    std::vector<QtPromise::QPromise<bool>,std::allocator<QtPromise::QPromise<bool>>>::
    emplace_back<QtPromise::QPromise<bool>>
              ((vector<QtPromise::QPromise<bool>,std::allocator<QtPromise::QPromise<bool>>> *)&d,
               (QPromise<bool> *)&local_e8);
    local_e8.d.d = (Data *)&PTR__QPromiseBase_00135530;
    if ((long *)local_e8.d.ptr != (long *)0x0) {
      LOCK();
      plVar6 = (long *)((long)local_e8.d.ptr + 8);
      *(int *)plVar6 = (int)*plVar6 + -1;
      UNLOCK();
      if (((int)*plVar6 == 0) && ((long *)local_e8.d.ptr != (long *)0x0)) {
        (**(code **)(*(long *)local_e8.d.ptr + 8))();
      }
    }
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0xc);
  QtPromise::all<bool,_std::vector,_std::allocator<QtPromise::QPromise<bool>_>_>
            ((QtPromise *)&local_88,
             (vector<QtPromise::QPromise<bool>,_std::allocator<QtPromise::QPromise<bool>_>_> *)&d);
  std::vector<QtPromise::QPromise<bool>,_std::allocator<QtPromise::QPromise<bool>_>_>::~vector
            ((vector<QtPromise::QPromise<bool>,_std::allocator<QtPromise::QPromise<bool>_>_> *)&d);
  pQVar3 = local_f0;
  if (local_f0 != (QArrayData *)0x0) {
    LOCK();
    (local_f0->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_f0->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001354b8;
  pPVar7 = (PromiseData<QList<int>_> *)operator_new(0x68);
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)
   &(pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData = 0;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (pPVar7->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size = 0;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size = 0;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d =
       (Data *)0x0;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d =
       (Data *)0x0;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
  *(undefined8 *)&(pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled =
       0;
  (pPVar7->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_00135980;
  QReadWriteLock::QReadWriteLock
            (&(pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock,0);
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled = false;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d =
       (Data *)0x0;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size = 0;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d =
       (Data *)0x0;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size = 0;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseData_00135918;
  (pPVar7->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar7->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar1 = &(pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData
  ;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar7 != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_e8.d.d = (Data *)&PTR__QPromiseBase_001358e0;
  local_e8.d.ptr = (int *)pPVar7;
  p.super_QPromiseBase<QList<int>_>.m_d.d = pPVar7;
  QtPromisePrivate::PromiseResolver<QList<int>_>::PromiseResolver
            ((PromiseResolver<QList<int>_> *)&resolver,(QPromise<QList<int>_> *)&local_e8);
  local_e8.d.d = (Data *)&PTR__QPromiseBase_001354b8;
  if ((PromiseData<QList<int>_> *)local_e8.d.ptr != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)local_e8.d.ptr)->
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<QList<int>_> *)local_e8.d.ptr != (PromiseData<QList<int>_> *)0x0)) {
      (*((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)local_e8.d.ptr)->
        _vptr_PromiseDataBase[1])();
    }
  }
  piVar4 = local_88.d.ptr;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_108 = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_c0 = resolver.m_d.d;
  d = (QArrayData *)resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  uStack_b0 = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_a8 = pQVar3;
  local_a0 = local_40;
  local_98 = 3;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_68.super__Function_base._M_manager = (_Manager_type)0x0;
  local_68._M_invoker = (_Invoker_type)0x0;
  local_68.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_68.super__Function_base._M_functor._8_8_ = 0;
  local_68.super__Function_base._M_functor._M_unused._M_object = operator_new(0x28);
  *(QArrayData **)local_68.super__Function_base._M_functor._M_unused._0_8_ = d;
  if (d != (QArrayData *)0x0) {
    LOCK();
    (d->ref_)._q_value.super___atomic_base<int>._M_i =
         (d->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_68.super__Function_base._M_functor._M_unused._0_8_ + 8) = uStack_b0;
  if ((Data *)uStack_b0 != (Data *)0x0) {
    LOCK();
    *(int *)uStack_b0 = *(int *)uStack_b0 + 1;
    UNLOCK();
  }
  *(QArrayData **)((long)local_68.super__Function_base._M_functor._M_unused._0_8_ + 0x10) = local_a8
  ;
  *(_Invoker_type *)((long)local_68.super__Function_base._M_functor._M_unused._0_8_ + 0x18) =
       local_a0;
  *(undefined8 *)((long)local_68.super__Function_base._M_functor._M_unused._0_8_ + 0x20) = local_98;
  if (local_a8 != (QArrayData *)0x0) {
    LOCK();
    (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_68._M_invoker =
       std::
       _Function_handler<void_(const_QList<bool>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
       ::_M_invoke;
  local_68.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_QList<bool>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
       ::_M_manager;
  if (local_a8 != (QArrayData *)0x0) {
    LOCK();
    (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_a8,4,8);
    }
  }
  if ((Data *)uStack_b0 != (Data *)0x0) {
    LOCK();
    *(int *)uStack_b0 = *(int *)uStack_b0 + -1;
    UNLOCK();
    if ((*(int *)uStack_b0 == 0) && ((Data *)uStack_b0 != (Data *)0x0)) {
      operator_delete((void *)uStack_b0,0x10);
    }
  }
  if (d != (QArrayData *)0x0) {
    LOCK();
    (d->ref_)._q_value.super___atomic_base<int>._M_i =
         (d->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((d->ref_)._q_value.super___atomic_base<int>._M_i == 0) && (d != (QArrayData *)0x0)) {
      operator_delete(d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)>::addHandler
            ((PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)> *)piVar4,&local_68);
  if (local_68.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_68.super__Function_base._M_manager)
              ((_Any_data *)&local_68,(_Any_data *)&local_68,__destroy_functor);
  }
  piVar4 = local_88.d.ptr;
  QtPromisePrivate::PromiseCatcher<QList<bool>,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&d,
             (PromiseCatcher<QList<bool>,decltype(nullptr),void> *)0x0,&local_108,
             (QPromiseResolve<QList<int>_> *)&local_c0,reject);
  QtPromisePrivate::PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)>::addCatcher
            ((PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)> *)piVar4,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&d);
  if (local_a8 != (QArrayData *)0x0) {
    (*(code *)local_a8)(&d,&d,3);
  }
  if (local_c0.d != (Data *)0x0) {
    LOCK();
    ((local_c0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_c0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if (((__int_type)
         ((local_c0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) &&
       (local_c0.d != (Data *)0x0)) {
      operator_delete(local_c0.d,0x10);
    }
  }
  if (local_108.d != (Data *)0x0) {
    LOCK();
    ((local_108.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_108.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((local_108.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       (local_108.d != (Data *)0x0)) {
      operator_delete(local_108.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  piVar4 = local_88.d.ptr;
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001358e0;
  bVar5 = QtPromisePrivate::PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)>::isPending
                    ((PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)> *)local_88.d.ptr);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)>::dispatch
              ((PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)> *)piVar4);
  }
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,4,8);
    }
  }
  local_88.d.d = (Data *)&PTR__QPromiseBase_001356e8;
  if ((PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)> *)local_88.d.ptr !=
      (PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)> *)0x0) {
    LOCK();
    pQVar1 = (QSharedData *)((long)local_88.d.ptr + 8);
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)> *)local_88.d.ptr !=
        (PromiseDataBase<QList<bool>,_void_(const_QList<bool>_&)> *)0x0)) {
      (*(*(_func_int ***)local_88.d.ptr)[1])();
    }
  }
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,4,8);
    }
  }
  local_88.d.d = (Data *)0x0;
  local_88.d.ptr = (int *)0x0;
  local_88.d.size = 0;
  waitForValue<QList<int>>(&local_e8,&p,&local_88);
  expectedBegin.i = (int *)QArrayData::allocate((QArrayData **)&resolver,4,8,2,KeepSize);
  expectedBegin.i[0] = 0x2a;
  expectedBegin.i[1] = 0x2c;
  QTest::_q_compareSequence<QList<int>::const_iterator,QList<int>::const_iterator>
            ((const_iterator)local_e8.d.ptr,(const_iterator)(local_e8.d.ptr + local_e8.d.size),
             expectedBegin,(const_iterator)(expectedBegin.i + 2),"waitForValue(p, QVector<int>{})",
             "(QVector<int>{42, 44})",
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_filter.cpp"
             ,0x44);
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver.m_d.d == 0) {
      QArrayData::deallocate((QArrayData *)resolver.m_d.d,4,8);
    }
  }
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,4,8);
    }
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,4,8);
    }
  }
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001354b8;
  if (p.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &((p.super_QPromiseBase<QList<int>_>.m_d.d)->
              super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0)) {
      (*((p.super_QPromiseBase<QList<int>_>.m_d.d)->
        super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_helpers_filter::sequenceTypes()
{
    SequenceTester<QList<int>>::exec();
    SequenceTester<QVector<int>>::exec();
    SequenceTester<std::list<int>>::exec();
    SequenceTester<std::vector<int>>::exec();
}